

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pySRUP_Syndicated_Device_List.cpp
# Opt level: O1

object get_sequence_dev_list(SRUP_MSG_SYNDICATED_DEV_LIST *self)

{
  uint32_t *puVar1;
  PyObject *pPVar2;
  SRUP_MSG_SYNDICATED_DEV_LIST *in_RSI;
  
  puVar1 = SRUP_MSG_SYNDICATED_DEV_LIST::device_sequence(in_RSI);
  if (puVar1 == (uint32_t *)0x0) {
    pPVar2 = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  else {
    pPVar2 = boost::python::api::object_initializer_impl<false,_false>::get<unsigned_int>(puVar1);
  }
  (self->super_SRUP_MSG)._vptr_SRUP_MSG = (_func_int **)pPVar2;
  return (object)(object_base)self;
}

Assistant:

boost::python::object get_sequence_dev_list (SRUP_MSG_SYNDICATED_DEV_LIST &self)
{
    const uint32_t* rv;
    rv = self.device_sequence();

    if (rv != nullptr)
        return boost::python::object(*rv);
    else
        return boost::python::object();
}